

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::runProcess(Process *this)

{
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  double probability;
  vector<int,_std::allocator<int>_> local_68;
  double local_40;
  double deltaT;
  double t0;
  int i;
  int k;
  vector<int,_std::allocator<int>_> distribution;
  Process *this_local;
  
  distribution.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  t0._4_4_ = 0;
  t0._0_4_ = 0;
  deltaT = (double)this->t;
  local_40 = this->tau;
  do {
    (**this->_vptr_Process)(deltaT,this,(ulong)t0._4_4_);
    iVar1 = yesOrNo(this,probability);
    if (iVar1 == 0) {
      local_40 = this->tau + local_40;
    }
    else {
      t0._4_4_ = t0._4_4_ + 1;
      local_40 = this->tau;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,(value_type_conflict *)((long)&t0 + 4));
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout," t = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,deltaT);
    poVar2 = std::operator<<(poVar2,"    f(t) = ");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)t0._0_4_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_8a81);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
    poVar2 = std::operator<<(poVar2,anon_var_dwarf_8a97);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    t0._0_4_ = t0._0_4_ + 1;
    deltaT = this->tau + deltaT;
  } while (deltaT < (double)this->T);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,(vector<int,_std::allocator<int>_> *)&i);
  fileOutPut(this,&local_68);
  std::vector<int,_std::allocator<int>_>::~vector(&local_68);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return;
}

Assistant:

void Process::runProcess() {
        std::vector <int> distribution;
        int k = 0;
        int i = 0;
        double t0 = t;
        double deltaT = tau;
            do{
                if (yesOrNo(probabilityPoisson(k, t0)) != 0){
                        k+=1;
                        deltaT = tau;
                    }
                else{
                    k+=0;
                    deltaT+=tau;
                }
                distribution.push_back(k);
                std::cout << std::endl;
                std::cout << " t = " << t0 << "    f(t) = " << distribution[i] << std::endl;
                std::cout << " Время без успеха: " << deltaT << " секунд" << std::endl;
                std::cout << std::endl;
                i++;
                t0+=tau;
              } while(t0 < T);
            fileOutPut(distribution);
}